

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void to_z80(i386 *i,vector<z80,_std::allocator<z80>_> *instructions)

{
  OpCode op;
  bool bVar1;
  const_reference this;
  char *pcVar2;
  exception *e;
  __normal_iterator<z80_*,_std::vector<z80,_std::allocator<z80>_>_> local_158;
  z80 *local_150;
  __normal_iterator<z80_*,_std::vector<z80,_std::allocator<z80>_>_> local_148;
  anon_class_32_1_8991f22b local_140;
  string local_120 [8];
  string text;
  Operand local_d8;
  size_type local_b0;
  size_type head;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_68;
  undefined1 local_48 [8];
  smatch match;
  vector<z80,_std::allocator<z80>_> *instructions_local;
  i386 *i_local;
  
  switch((i->super_ASMLine).type) {
  case Label:
  case Comment:
    std::vector<z80,std::allocator<z80>>::
    emplace_back<ASMLine::Type_const&,std::__cxx11::string_const&>
              ((vector<z80,std::allocator<z80>> *)instructions,(Type *)i,&(i->super_ASMLine).text);
    break;
  case Instruction:
    local_b0 = std::vector<z80,_std::allocator<z80>_>::size(instructions);
    op = i->opcode;
    Operand::Operand(&local_d8,&i->operand1);
    Operand::Operand((Operand *)((long)&text.field_2 + 8),&i->operand2);
    translate_instruction(instructions,op,&local_d8,(Operand *)((long)&text.field_2 + 8));
    Operand::~Operand((Operand *)((long)&text.field_2 + 8));
    Operand::~Operand(&local_d8);
    std::__cxx11::string::string(local_120,(string *)&i->line_text);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_120);
    if (*pcVar2 == '\t') {
      std::__cxx11::string::erase((ulong)local_120,0);
    }
    local_150 = (z80 *)std::vector<z80,_std::allocator<z80>_>::begin(instructions);
    local_148 = std::next<__gnu_cxx::__normal_iterator<z80*,std::vector<z80,std::allocator<z80>>>>
                          ((__normal_iterator<z80_*,_std::vector<z80,_std::allocator<z80>_>_>)
                           local_150,local_b0);
    local_158._M_current = (z80 *)std::vector<z80,_std::allocator<z80>_>::end(instructions);
    std::__cxx11::string::string((string *)&e,local_120);
    std::
    for_each<__gnu_cxx::__normal_iterator<z80*,std::vector<z80,std::allocator<z80>>>,to_z80(i386_const&,std::vector<z80,std::allocator<z80>>&)::__0>
              (&local_140,local_148,local_158,(anon_class_32_1_8991f22b *)&e);
    to_z80(i386_const&,std::vector<z80,std::allocator<z80>>&)::$_0::~__0((__0 *)&local_140);
    to_z80(i386_const&,std::vector<z80,std::allocator<z80>>&)::$_0::~__0((__0 *)&e);
    std::__cxx11::string::~string(local_120);
    break;
  case Directive:
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_48);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_68,"\\.asciz\\s(.*)",0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&(i->super_ASMLine).text,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_48,&local_68,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_68);
    if (bVar1) {
      this = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_48,1);
      std::__cxx11::sub_match::operator_cast_to_string((string_type *)&head,(sub_match *)this);
      std::operator+(&local_88,".asciiz ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&head);
      std::vector<z80,std::allocator<z80>>::emplace_back<ASMLine::Type_const&,std::__cxx11::string>
                ((vector<z80,std::allocator<z80>> *)instructions,(Type *)i,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&head);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_48);
  }
  return;
}

Assistant:

void to_z80(const i386& i, std::vector<z80>& instructions) {
	try {
		switch (i.type) {
			case ASMLine::Type::Label:
			case ASMLine::Type::Comment:
				instructions.emplace_back(i.type, i.text);
				return;
			case ASMLine::Type::Directive:
				{
					std::smatch match;
					if (std::regex_match(i.text, match, std::regex(R"(\.asciz\s(.*))"))) {
						instructions.emplace_back(i.type, ".asciiz " + std::string(match[1]));
					}
				}
				return;
			case ASMLine::Type::Instruction:
				const auto head = instructions.size();
				translate_instruction(instructions, i.opcode, i.operand1, i.operand2);

				auto text = i.line_text;
				if (text[0] == '\t') {
					text.erase(0, 1);
				}
				for_each(std::next(instructions.begin(), head), instructions.end(),
						[text](auto& ins) {
							ins.comment = text;
						}
				);
				return;
		}
	}
	catch (const std::exception& e) {
		log(LogLevel::Error, i, e.what());
	}
}